

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::FreeZeroObjVariablePS::execute
          (FreeZeroObjVariablePS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  SVectorBase<double> *pSVar1;
  int iVar2;
  uint uVar3;
  pointer pdVar4;
  Nonzero<double> *pNVar5;
  pointer pdVar6;
  VarStatus *pVVar7;
  pointer pDVar8;
  VarStatus *pVVar9;
  undefined1 auVar10 [16];
  double *pdVar11;
  ulong uVar12;
  int k_3;
  long lVar13;
  ulong uVar14;
  int k;
  int iVar15;
  ulong uVar16;
  int *piVar17;
  ulong uVar18;
  long lVar19;
  int k_2;
  VarStatus VVar20;
  bool bVar21;
  bool bVar22;
  double dVar23;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar28;
  undefined1 auVar27 [16];
  double val;
  double local_d8;
  double local_d0;
  VectorBase<double> *local_c8;
  VectorBase<double> *local_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double local_88;
  double local_78;
  ulong uStack_70;
  VectorBase<double> *local_60;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *local_58;
  DSVectorBase<double> slack;
  
  iVar15 = this->m_j;
  iVar2 = this->m_old_j;
  if (iVar15 != iVar2) {
    pdVar4 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[iVar2] = pdVar4[iVar15];
    pdVar4 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[iVar2] = pdVar4[iVar15];
    cStatus->data[iVar2] = cStatus->data[iVar15];
  }
  uVar3 = (this->m_col).super_SVectorBase<double>.memused;
  pNVar5 = (this->m_col).super_SVectorBase<double>.m_elem;
  pdVar4 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar7 = rStatus->data;
  lVar19 = (long)(int)(this->m_old_i - uVar3);
  lVar13 = 0;
  uVar14 = 0;
  if (0 < (int)uVar3) {
    uVar14 = (ulong)uVar3;
  }
  for (; uVar14 * 4 != lVar13; lVar13 = lVar13 + 4) {
    iVar15 = (&pNVar5->idx)[lVar13];
    *(double *)((long)pdVar4 + lVar13 * 2 + lVar19 * 8 + 8) = pdVar4[iVar15];
    *(double *)((long)pdVar6 + lVar13 * 2 + lVar19 * 8 + 8) = pdVar6[iVar15];
    *(VarStatus *)((long)pVVar7 + lVar13 + lVar19 * 4 + 4) = pVVar7[iVar15];
  }
  local_c8 = s;
  local_c0 = y;
  local_60 = r;
  local_58 = cStatus;
  DSVectorBase<double>::DSVectorBase(&slack,uVar3);
  bVar22 = this->m_loFree;
  pdVar11 = (double *)infinity();
  dVar24 = *pdVar11;
  uVar14 = 0;
  if (bVar22 == false) {
    uVar14 = 0x8000000000000000;
    dVar24 = -dVar24;
    uVar18 = 0xffffffffffffffff;
    pSVar1 = &(this->m_lRhs).super_SVectorBase<double>;
    for (uVar16 = 0;
        pDVar8 = (this->m_rows).data.
                 super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        (long)uVar16 <
        (long)(int)((ulong)((long)(this->m_rows).data.
                                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar8) >> 5);
        uVar16 = uVar16 + 1) {
      val = 0.0;
      uVar3 = pDVar8[uVar16].super_SVectorBase<double>.memused;
      uVar12 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar12 = 0;
      }
      dVar23 = 0.0;
      for (lVar13 = 0; uVar12 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
        pNVar5 = pDVar8[uVar16].super_SVectorBase<double>.m_elem;
        iVar15 = *(int *)((long)&pNVar5->idx + lVar13);
        if (iVar15 != this->m_j) {
          dVar23 = dVar23 + *(double *)((long)&pNVar5->val + lVar13) *
                            (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar15];
          val = dVar23;
        }
      }
      iVar15 = (int)uVar16;
      local_78 = dVar24;
      uStack_70 = uVar14;
      local_98 = SVectorBase<double>::operator[](pSVar1,iVar15);
      local_a8 = val;
      uStack_a0 = 0;
      local_88 = SVectorBase<double>::operator[](pSVar1,iVar15);
      local_b8 = val;
      uStack_b0 = 0;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      local_d0 = extraout_XMM0_Qa_00;
      local_d8 = SVectorBase<double>::operator[]
                           (&pDVar8[uVar16].super_SVectorBase<double>,this->m_j);
      DSVectorBase<double>::add(&slack,iVar15,&val);
      dVar24 = ABS(local_98);
      if (ABS(local_98) <= ABS(local_a8)) {
        dVar24 = ABS(local_a8);
      }
      dVar23 = 1.0;
      if (1.0 <= dVar24) {
        dVar23 = dVar24;
      }
      auVar27._8_8_ = local_b8;
      auVar27._0_8_ = local_88;
      auVar26._8_8_ = dVar23;
      auVar26._0_8_ = dVar23;
      auVar26 = divpd(auVar27,auVar26);
      dVar28 = auVar26._8_8_;
      dVar24 = auVar26._0_8_ - dVar28;
      uVar14 = ~(ulong)ABS(dVar28) & (ulong)dVar28;
      dVar24 = ((double)(~-(ulong)(ABS(dVar24) <= local_d0) & (ulong)dVar24) * dVar23) / local_d8;
      if (local_78 < dVar24) {
        uVar18 = uVar16;
      }
      uVar18 = uVar18 & 0xffffffff;
      if (dVar24 <= local_78) {
        dVar24 = local_78;
      }
    }
    dVar23 = this->m_bnd;
    bVar22 = dVar23 == dVar24;
    bVar21 = dVar23 < dVar24;
  }
  else {
    pSVar1 = &(this->m_lRhs).super_SVectorBase<double>;
    uVar18 = 0xffffffffffffffff;
    for (uVar16 = 0;
        pDVar8 = (this->m_rows).data.
                 super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        (long)uVar16 <
        (long)(int)((ulong)((long)(this->m_rows).data.
                                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar8) >> 5);
        uVar16 = uVar16 + 1) {
      val = 0.0;
      uVar3 = pDVar8[uVar16].super_SVectorBase<double>.memused;
      uVar12 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar12 = 0;
      }
      dVar23 = 0.0;
      for (lVar13 = 0; uVar12 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
        pNVar5 = pDVar8[uVar16].super_SVectorBase<double>.m_elem;
        iVar15 = *(int *)((long)&pNVar5->idx + lVar13);
        if (iVar15 != this->m_j) {
          dVar23 = dVar23 + *(double *)((long)&pNVar5->val + lVar13) *
                            (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar15];
          val = dVar23;
        }
      }
      iVar15 = (int)uVar16;
      local_78 = dVar24;
      uStack_70 = uVar14;
      local_98 = SVectorBase<double>::operator[](pSVar1,iVar15);
      local_a8 = val;
      uStack_a0 = 0;
      local_88 = SVectorBase<double>::operator[](pSVar1,iVar15);
      local_b8 = val;
      uStack_b0 = 0;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      local_d0 = extraout_XMM0_Qa;
      local_d8 = SVectorBase<double>::operator[]
                           (&pDVar8[uVar16].super_SVectorBase<double>,this->m_j);
      DSVectorBase<double>::add(&slack,iVar15,&val);
      dVar24 = ABS(local_98);
      if (ABS(local_98) <= ABS(local_a8)) {
        dVar24 = ABS(local_a8);
      }
      dVar23 = 1.0;
      if (1.0 <= dVar24) {
        dVar23 = dVar24;
      }
      auVar25._8_8_ = local_b8;
      auVar25._0_8_ = local_88;
      auVar10._8_8_ = dVar23;
      auVar10._0_8_ = dVar23;
      auVar26 = divpd(auVar25,auVar10);
      dVar28 = auVar26._8_8_;
      dVar24 = auVar26._0_8_ - dVar28;
      uVar14 = ~(ulong)ABS(dVar28) & (ulong)dVar28;
      dVar24 = ((double)(~-(ulong)(ABS(dVar24) <= local_d0) & (ulong)dVar24) * dVar23) / local_d8;
      if (dVar24 < local_78) {
        uVar18 = uVar16;
      }
      uVar18 = uVar18 & 0xffffffff;
      if (local_78 <= dVar24) {
        dVar24 = local_78;
      }
    }
    dVar23 = this->m_bnd;
    bVar22 = dVar24 == dVar23;
    bVar21 = dVar24 < dVar23;
  }
  pdVar4 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar21 || bVar22) {
    pdVar4[this->m_j] = dVar24;
  }
  else {
    pdVar4[this->m_j] = dVar23;
    uVar18 = 0xffffffffffffffff;
  }
  lVar13 = 8;
  for (lVar19 = 0; uVar14 = (ulong)(this->m_col).super_SVectorBase<double>.memused,
      lVar19 < (long)uVar14; lVar19 = lVar19 + 1) {
    dVar24 = SVectorBase<double>::operator[](&slack.super_SVectorBase<double>,(int)lVar19);
    pNVar5 = (this->m_col).super_SVectorBase<double>.m_elem;
    (local_c8->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[*(int *)((long)&pNVar5->val + lVar13)] =
         *(double *)((long)pNVar5 + lVar13 + -8) *
         (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[this->m_j] + dVar24;
    lVar13 = lVar13 + 0x10;
  }
  (local_60->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[this->m_j] = 0.0;
  lVar13 = 8;
  lVar19 = 0;
  while( true ) {
    pNVar5 = (this->m_col).super_SVectorBase<double>.m_elem;
    if ((int)uVar14 <= lVar19) break;
    iVar15 = *(int *)((long)&pNVar5->val + lVar13);
    dVar24 = SVectorBase<double>::operator[](&(this->m_rowObj).super_SVectorBase<double>,iVar15);
    (local_c0->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar15] = dVar24;
    lVar19 = lVar19 + 1;
    uVar14 = (ulong)(uint)(this->m_col).super_SVectorBase<double>.memused;
    lVar13 = lVar13 + 0x10;
  }
  pVVar7 = rStatus->data;
  iVar15 = this->m_j;
  pVVar9 = local_58->data;
  bVar22 = this->m_loFree;
  uVar12 = 0;
  uVar16 = uVar14 & 0xffffffff;
  if ((int)uVar14 < 1) {
    uVar16 = uVar12;
  }
  uVar14 = uVar18 & 0xffffffff;
  for (; uVar16 * 0x10 != uVar12; uVar12 = uVar12 + 0x10) {
    if (uVar14 * 0x10 == uVar12) {
      pVVar9[iVar15] = BASIC;
      if ((bVar22 & 1U) == 0) {
        bVar21 = 0.0 < pNVar5[uVar14].val;
      }
      else {
        bVar21 = pNVar5[uVar14].val <= 0.0;
      }
      VVar20 = (VarStatus)bVar21;
      piVar17 = &pNVar5[uVar14].idx;
    }
    else {
      piVar17 = (int *)((long)&pNVar5->idx + uVar12);
      VVar20 = BASIC;
    }
    pVVar7[*piVar17] = VVar20;
  }
  if ((int)uVar18 == -1) {
    pVVar9[this->m_j] = this->m_loFree ^ ON_LOWER;
  }
  DSVectorBase<double>::~DSVectorBase(&slack);
  return;
}

Assistant:

void SPxMainSM<R>::FreeZeroObjVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   int rIdx = m_old_i - m_col.size() + 1;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int rIdx_new = m_col.index(k);
      s[rIdx] = s[rIdx_new];
      y[rIdx] = y[rIdx_new];
      rStatus[rIdx] = rStatus[rIdx_new];
      rIdx++;
   }

   // primal:
   int      domIdx = -1;
   DSVectorBase<R> slack(m_col.size());

   if(m_loFree)
   {
      R minRowUp = R(infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R           val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R up = z * scale / row[m_j];
         slack.add(k, val);

         if(up < minRowUp)
         {
            minRowUp = up;
            domIdx   = k;
         }
      }

      if(m_bnd < minRowUp)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = minRowUp;
   }
   else
   {
      R maxRowLo = R(-infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R lo = z * scale / row[m_j];
         slack.add(k, val);

         if(lo > maxRowLo)
         {
            maxRowLo = lo;
            domIdx   = k;
         }
      }

      if(m_bnd > maxRowLo)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = maxRowLo;
   }

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] = slack[k] + m_col.value(k) * x[m_j];

   // dual:
   r[m_j] = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int idx = m_col.index(k);
      y[idx] = m_rowObj[idx];
   }

   // basis:
   for(int k = 0; k < m_col.size(); ++k)
   {
      if(k != domIdx)
         rStatus[m_col.index(k)] = SPxSolverBase<R>::BASIC;

      else
      {
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

         if(m_loFree)
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_UPPER :
                                      SPxSolverBase<R>::ON_LOWER;
         else
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_LOWER :
                                      SPxSolverBase<R>::ON_UPPER;
      }
   }

   if(domIdx == -1)
   {
      if(m_loFree)
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM20 Dimension doesn't match after this step.");
   }

#endif
}